

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_op_update3_cc(DisasContext *s,TCGv_i64 reg)

{
  TCGContext *tcg_ctx;
  uintptr_t o_1;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (tcg_ctx->cpu_cc_src2 != reg) {
    tcg_gen_op2_x86_64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(tcg_ctx->cpu_cc_src2 + (long)tcg_ctx),
                       (TCGArg)(reg + (long)tcg_ctx));
  }
  if (tcg_ctx->cpu_cc_src != s->T1) {
    tcg_gen_op2_x86_64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(tcg_ctx->cpu_cc_src + (long)tcg_ctx),
                       (TCGArg)(s->T1 + (long)tcg_ctx));
  }
  if (tcg_ctx->cpu_cc_dst != s->T0) {
    tcg_gen_op2_x86_64(tcg_ctx,INDEX_op_mov_i64,(TCGArg)(tcg_ctx->cpu_cc_dst + (long)tcg_ctx),
                       (TCGArg)(s->T0 + (long)tcg_ctx));
    return;
  }
  return;
}

Assistant:

static void gen_op_update3_cc(DisasContext *s, TCGv reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src2, reg);
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_src, s->T1);
    tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_cc_dst, s->T0);
}